

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

bool operator<(QSettingsIniKey *k1,QSettingsIniKey *k2)

{
  QString *in_RSI;
  QString *in_RDI;
  bool local_1;
  
  if (in_RDI[1].d.d == in_RSI[1].d.d) {
    local_1 = operator<(in_RDI,in_RSI);
  }
  else {
    local_1 = (long)in_RDI[1].d.d < (long)in_RSI[1].d.d;
  }
  return local_1;
}

Assistant:

static bool operator<(const QSettingsIniKey &k1, const QSettingsIniKey &k2)
{
    if (k1.position != k2.position)
        return k1.position < k2.position;
    return static_cast<const QString &>(k1) < static_cast<const QString &>(k2);
}